

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bassign(bstring a,const_bstring b)

{
  int iVar1;
  const_bstring b_local;
  bstring a_local;
  
  if (((b == (const_bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 0)) {
    a_local._4_4_ = -1;
  }
  else {
    if (b->slen == 0) {
      if (((a == (bstring)0x0) || (a->data == (uchar *)0x0)) ||
         ((a->mlen < a->slen || ((a->slen < 0 || (a->mlen == 0)))))) {
        return -1;
      }
    }
    else {
      iVar1 = balloc(a,b->slen);
      if (iVar1 != 0) {
        return -1;
      }
      memmove(a->data,b->data,(long)b->slen);
    }
    a->data[b->slen] = '\0';
    a->slen = b->slen;
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int bassign (bstring a, const_bstring b) {
	if (b == NULL || b->data == NULL || b->slen < 0)
		return BSTR_ERR;
	if (b->slen != 0) {
		if (balloc (a, b->slen) != BSTR_OK) return BSTR_ERR;
		bstr__memmove (a->data, b->data, b->slen);
	} else {
		if (a == NULL || a->data == NULL || a->mlen < a->slen ||
		    a->slen < 0 || a->mlen == 0)
			return BSTR_ERR;
	}
	a->data[b->slen] = (unsigned char) '\0';
	a->slen = b->slen;
	return BSTR_OK;
}